

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool __thiscall leveldb::VersionSet::ReuseManifest(VersionSet *this,string *dscname,string *dscbase)

{
  WritableFile **ppWVar1;
  ulong uVar2;
  Logger *info_log;
  uint64_t uVar3;
  bool bVar4;
  Writer *this_00;
  Status r;
  FileType manifest_type;
  uint64_t manifest_size;
  uint64_t manifest_number;
  string local_48;
  
  if (this->options_->reuse_logs == true) {
    bVar4 = ParseFileName(dscbase,&manifest_number,&manifest_type);
    if (!bVar4) {
      return false;
    }
    if (manifest_type != kDescriptorFile) {
      return false;
    }
    (*this->env_->_vptr_Env[0xb])(&local_48,this->env_,dscname,&manifest_size);
    uVar3 = manifest_size;
    if (local_48._M_dataplus._M_p == (pointer)0x0) {
      uVar2 = this->options_->max_file_size;
      Status::~Status((Status *)&local_48);
      if (uVar3 < uVar2) {
        if (this->descriptor_file_ != (WritableFile *)0x0) {
          __assert_fail("descriptor_file_ == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                        ,0x402,
                        "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                       );
        }
        if (this->descriptor_log_ == (Writer *)0x0) {
          ppWVar1 = &this->descriptor_file_;
          (*this->env_->_vptr_Env[5])(&r,this->env_,dscname,ppWVar1);
          info_log = this->options_->info_log;
          if (r.state_ == (char *)0x0) {
            Log(info_log,"Reusing MANIFEST %s\n",(dscname->_M_dataplus)._M_p);
            this_00 = (Writer *)operator_new(0x20);
            log::Writer::Writer(this_00,*ppWVar1,manifest_size);
            this->descriptor_log_ = this_00;
            this->manifest_file_number_ = manifest_number;
          }
          else {
            Status::ToString_abi_cxx11_(&local_48,&r);
            Log(info_log,"Reuse MANIFEST: %s\n",local_48._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_48);
            if (*ppWVar1 != (WritableFile *)0x0) {
              __assert_fail("descriptor_file_ == nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                            ,0x407,
                            "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                           );
            }
          }
          Status::~Status(&r);
          return r.state_ == (char *)0x0;
        }
        __assert_fail("descriptor_log_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                      ,0x403,
                      "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                     );
      }
    }
    else {
      Status::~Status((Status *)&local_48);
    }
  }
  return false;
}

Assistant:

bool VersionSet::ReuseManifest(const std::string& dscname,
                               const std::string& dscbase) {
  if (!options_->reuse_logs) {
    return false;
  }
  FileType manifest_type;
  uint64_t manifest_number;
  uint64_t manifest_size;
  if (!ParseFileName(dscbase, &manifest_number, &manifest_type) ||
      manifest_type != kDescriptorFile ||
      !env_->GetFileSize(dscname, &manifest_size).ok() ||
      // Make new compacted MANIFEST if old one is too big
      manifest_size >= TargetFileSize(options_)) {
    return false;
  }

  assert(descriptor_file_ == nullptr);
  assert(descriptor_log_ == nullptr);
  Status r = env_->NewAppendableFile(dscname, &descriptor_file_);
  if (!r.ok()) {
    Log(options_->info_log, "Reuse MANIFEST: %s\n", r.ToString().c_str());
    assert(descriptor_file_ == nullptr);
    return false;
  }

  Log(options_->info_log, "Reusing MANIFEST %s\n", dscname.c_str());
  descriptor_log_ = new log::Writer(descriptor_file_, manifest_size);
  manifest_file_number_ = manifest_number;
  return true;
}